

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_init_custom(nk_context *ctx,nk_buffer *cmds,nk_buffer *pool,nk_user_font *font)

{
  nk_allocator *alloc;
  nk_user_font *font_local;
  nk_buffer *pool_local;
  nk_buffer *cmds_local;
  nk_context *ctx_local;
  
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3a3f,
                  "int nk_init_custom(struct nk_context *, struct nk_buffer *, struct nk_buffer *, const struct nk_user_font *)"
                 );
  }
  if (pool != (nk_buffer *)0x0) {
    if ((cmds == (nk_buffer *)0x0) || (pool == (nk_buffer *)0x0)) {
      ctx_local._4_4_ = 0;
    }
    else {
      nk_setup(ctx,font);
      memcpy(&ctx->memory,cmds,0x78);
      if (pool->type == NK_BUFFER_FIXED) {
        nk_pool_init_fixed(&ctx->pool,(pool->memory).ptr,(pool->memory).size);
      }
      else {
        nk_pool_init(&ctx->pool,&pool->pool,0x10);
      }
      ctx->use_pool = 1;
      ctx_local._4_4_ = 1;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("pool",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x3a40,
                "int nk_init_custom(struct nk_context *, struct nk_buffer *, struct nk_buffer *, const struct nk_user_font *)"
               );
}

Assistant:

NK_API int
nk_init_custom(struct nk_context *ctx, struct nk_buffer *cmds,
    struct nk_buffer *pool, const struct nk_user_font *font)
{
    NK_ASSERT(cmds);
    NK_ASSERT(pool);
    if (!cmds || !pool) return 0;

    nk_setup(ctx, font);
    ctx->memory = *cmds;
    if (pool->type == NK_BUFFER_FIXED) {
        /* take memory from buffer and alloc fixed pool */
        nk_pool_init_fixed(&ctx->pool, pool->memory.ptr, pool->memory.size);
    } else {
        /* create dynamic pool from buffer allocator */
        struct nk_allocator *alloc = &pool->pool;
        nk_pool_init(&ctx->pool, alloc, NK_POOL_DEFAULT_CAPACITY);
    }
    ctx->use_pool = nk_true;
    return 1;
}